

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

void __thiscall QToolBarAreaLayout::deleteAllLayoutItems(QToolBarAreaLayout *this)

{
  long *plVar1;
  pointer pQVar2;
  pointer pQVar3;
  long lVar4;
  long lVar5;
  int j;
  ulong uVar6;
  int k;
  ulong uVar7;
  
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    for (uVar6 = 0; uVar6 < (ulong)this->docks[lVar4].lines.d.size; uVar6 = uVar6 + 1) {
      pQVar2 = QList<QToolBarAreaLayoutLine>::data(&this->docks[lVar4].lines);
      lVar5 = 0;
      for (uVar7 = 0; uVar7 < (ulong)pQVar2[uVar6].toolBarItems.d.size; uVar7 = uVar7 + 1) {
        pQVar3 = QList<QToolBarAreaLayoutItem>::data(&pQVar2[uVar6].toolBarItems);
        if (((&pQVar3->gap)[lVar5] == false) &&
           (plVar1 = *(long **)((long)&pQVar3->widgetItem + lVar5), plVar1 != (long *)0x0)) {
          (**(code **)(*plVar1 + 8))();
        }
        *(undefined8 *)((long)&pQVar3->widgetItem + lVar5) = 0;
        lVar5 = lVar5 + 0x18;
      }
    }
  }
  return;
}

Assistant:

void QToolBarAreaLayout::deleteAllLayoutItems()
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            QToolBarAreaLayoutLine &line = dock.lines[j];

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                QToolBarAreaLayoutItem &item = line.toolBarItems[k];
                if (!item.gap)
                    delete item.widgetItem;
                item.widgetItem = nullptr;
            }
        }
    }
}